

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::writeCastType(ExprWriter *this,Type *Ty)

{
  ostream *poVar1;
  ret_type __lhs;
  long *in_RSI;
  long in_RDI;
  uint i;
  ret_type PT;
  Type *in_stack_ffffffffffffff70;
  string *psVar2;
  string local_70 [32];
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar3;
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 8),"(");
  (**(code **)(*local_10 + 0x18))();
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  __lhs = llvm::dyn_cast_or_null<PointerType_const,Type>(in_stack_ffffffffffffff70);
  if ((__lhs != (ret_type)0x0) && ((__lhs->isArrayPointer & 1U) != 0)) {
    std::operator<<(*(ostream **)(in_RDI + 8)," (");
    for (uVar3 = 0; uVar3 < __lhs->levels; uVar3 = uVar3 + 1) {
      std::operator<<(*(ostream **)(in_RDI + 8),"*");
    }
    poVar1 = *(ostream **)(in_RDI + 8);
    psVar2 = local_70;
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffffb0));
    std::operator<<(poVar1,psVar2);
    std::__cxx11::string::~string(local_70);
  }
  std::operator<<(*(ostream **)(in_RDI + 8),")");
  return;
}

Assistant:

void ExprWriter::writeCastType(Type *Ty) {
    ss << "(" << Ty->toString();
    if (auto PT = llvm::dyn_cast_or_null<const PointerType>(Ty)) {
        if (PT->isArrayPointer) {
            ss << " (";
            for (unsigned i = 0; i < PT->levels; i++) {
                ss << "*";
            }
            ss << ")" + PT->sizes;
        }
    }
    ss << ")";
}